

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_nyi(jit_State *J,RecordFFData *rd)

{
  size_t __n;
  TValue *__dest;
  TValue *__src;
  uint8_t uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  lua_State *L;
  TValue *pTVar5;
  TRef *pTVar6;
  TRef TVar7;
  int errcode;
  ulong uVar8;
  
  if ((J->cur).nins < J->param[5] + 0x8000U) {
    lj_trace_err_info(J,LJ_TRERR_TRACEUV);
  }
  if (J->framedepth != 0) {
    L = J->L;
    pTVar5 = L->base;
    uVar3 = *(uint *)((long)pTVar5 + -4);
    if (((((uVar3 & 3) == 0) && (uVar4 = *(uint *)(ulong)uVar3, (uVar4 & 0xfd) != 0x41)) &&
        ((char)uVar4 != '?')) && ((uVar4 & 0xff) != 0x49)) {
      uVar1 = (J->fn->c).ffid;
      if (((uVar1 != '\x13') && (uVar1 != 0x8b)) && (uVar1 != 0x91)) {
        uVar8 = (ulong)(J->maxslot + 1);
        __dest = pTVar5 + 1;
        __src = pTVar5 + -1;
        bVar2 = *(byte *)((long)(ulong)uVar3 + -3);
        __n = uVar8 * 8;
        memmove(__dest,__src,__n);
        *(uint *)((long)pTVar5 + 0xc) = ((int)__dest - ((int)__src + ~(uint)bVar2 * 8)) + 2;
        pTVar5->n = 7.71335286287354e-320;
        (pTVar5->field_2).it = uVar3;
        *(undefined4 *)((long)pTVar5 + -4) = 0xffffffff;
        L->base = L->base + 2;
        L->top = L->top + 2;
        memmove(J->base + 1,J->base + -1,uVar8 << 2);
        TVar7 = lj_ir_kptr_(J,IR_KPTR,(void *)0x3cfc);
        *J->base = TVar7 | 0x20000;
        TVar7 = lj_ir_ktrace(J);
        pTVar6 = J->base;
        pTVar6[-1] = TVar7;
        J->ktrace = (IRRef1)TVar7;
        J->base = pTVar6 + 2;
        J->baseslot = J->baseslot + 2;
        J->framedepth = J->framedepth + 1;
        errcode = lj_vm_cpcall(L,0,J,rec_stop_stitch_cp);
        memmove(__src,__dest,__n);
        *(uint *)((long)pTVar5 + -4) = uVar3;
        L->base = L->base + -2;
        pTVar5 = L->top;
        L->top = pTVar5 + -2;
        if (errcode != 0) {
          if (errcode == 2) {
            pTVar5[-3] = pTVar5[-1];
          }
          else {
            pTVar5[-3].u64 = 0;
          }
          lj_err_throw(L,errcode);
        }
        goto LAB_0013799e;
      }
    }
  }
  lj_record_stop(J,LJ_TRLINK_RETURN,0);
LAB_0013799e:
  rd->nres = -1;
  return;
}

Assistant:

static void LJ_FASTCALL recff_nyi(jit_State *J, RecordFFData *rd)
{
  if (J->cur.nins < (IRRef)J->param[JIT_P_minstitch] + REF_BASE) {
    lj_trace_err_info(J, LJ_TRERR_TRACEUV);
  } else {
    /* Can only stitch from Lua call. */
    if (J->framedepth && frame_islua(J->L->base-1)) {
      BCOp op = bc_op(*frame_pc(J->L->base-1));
      /* Stitched trace cannot start with *M op with variable # of args. */
      if (!(op == BC_CALLM || op == BC_CALLMT ||
	    op == BC_RETM || op == BC_TSETM)) {
	switch (J->fn->c.ffid) {
	case FF_error:
	case FF_debug_sethook:
	case FF_jit_flush:
	  break;  /* Don't stitch across special builtins. */
	default:
	  recff_stitch(J);  /* Use trace stitching. */
	  rd->nres = -1;
	  return;
	}
      }
    }
    /* Otherwise stop trace and return to interpreter. */
    lj_record_stop(J, LJ_TRLINK_RETURN, 0);
    rd->nres = -1;
  }
}